

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::ensureModuleVar(Wasm2JSBuilder *this,Ref ast,Importable *imp)

{
  ValueBuilder *this_00;
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  Ref r;
  Ref RVar5;
  Ref RVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  __hashtable *__h;
  void *pvVar7;
  Ref in_R8;
  Name name;
  IString str;
  IString IVar8;
  IString name_00;
  __node_gen_type __node_gen;
  
  sVar4 = std::
          _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->seenModuleImports)._M_h,&(imp->module).super_IString);
  if (sVar4 == 0) {
    r = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,r);
    name.super_IString.str._M_str = extraout_RDX;
    name.super_IString.str._M_len = (size_t)(imp->module).super_IString.str._M_str;
    bVar3 = needsQuoting((wasm *)(imp->module).super_IString.str._M_len,name);
    pcVar1 = _ZN4wasmL12importObjectE_1;
    sVar2 = _ZN4wasmL12importObjectE_0;
    pvVar7 = (void *)0x18;
    RVar5.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
    (RVar5.inst)->type = Null;
    cashew::Value::free(RVar5.inst,pvVar7);
    (RVar5.inst)->type = String;
    ((RVar5.inst)->field_1).str.str._M_len = sVar2;
    ((RVar5.inst)->field_1).str.str._M_str = pcVar1;
    this_00 = (ValueBuilder *)(imp->module).super_IString.str._M_len;
    pcVar1 = (imp->module).super_IString.str._M_str;
    if (bVar3) {
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = (size_t)pcVar1;
      RVar6 = cashew::ValueBuilder::makeString(this_00,str);
      RVar5 = cashew::ValueBuilder::makeSub(RVar5,RVar6);
    }
    else {
      pvVar7 = (void *)0x18;
      RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
      (RVar6.inst)->type = Null;
      cashew::Value::free(RVar6.inst,pvVar7);
      (RVar6.inst)->type = String;
      ((RVar6.inst)->field_1).arr = (ArrayStorage *)this_00;
      ((RVar6.inst)->field_1).str.str._M_str = pcVar1;
      RVar5 = cashew::ValueBuilder::makeDot(RVar5,RVar6);
    }
    IVar8 = fromName(this,(imp->module).super_IString.str,Top);
    name_00.str._M_len = IVar8.str._M_str;
    name_00.str._M_str = (char *)RVar5.inst;
    cashew::ValueBuilder::appendToVar
              ((ValueBuilder *)r.inst,(Value *)IVar8.str._M_len,name_00,in_R8);
    std::
    _Hashtable<wasm::IString,wasm::IString,std::allocator<wasm::IString>,std::__detail::_Identity,std::equal_to<wasm::IString>,std::hash<wasm::IString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::IString_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::IString,true>>>>
              ((_Hashtable<wasm::IString,wasm::IString,std::allocator<wasm::IString>,std::__detail::_Identity,std::equal_to<wasm::IString>,std::hash<wasm::IString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->seenModuleImports,&imp->module);
  }
  return;
}

Assistant:

void Wasm2JSBuilder::ensureModuleVar(Ref ast, const Importable& imp) {
  if (seenModuleImports.count(imp.module) > 0) {
    return;
  }
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  Ref rhs;
  if (needsQuoting(imp.module)) {
    rhs = ValueBuilder::makeSub(ValueBuilder::makeName(importObject),
                                ValueBuilder::makeString(imp.module));
  } else {
    rhs = ValueBuilder::makeDot(ValueBuilder::makeName(importObject),
                                ValueBuilder::makeName(imp.module));
  }

  ValueBuilder::appendToVar(theVar, fromName(imp.module, NameScope::Top), rhs);
  seenModuleImports.insert(imp.module);
}